

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

int newUser(string *cmd,int socket_fd)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ssize_t sVar5;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_2d8;
  anon_class_32_1_d815ae54_for__M_pred local_2d0;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_2b0;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_2a8;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> local_2a0;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> it;
  vector<User,_std::allocator<User>_> users;
  ostream local_278 [8];
  ofstream usersFile;
  string local_68 [8];
  string password;
  string local_48 [8];
  string username;
  size_t spacePos;
  int socket_fd_local;
  string *cmd_local;
  
  std::__cxx11::string::find((char *)cmd,0x118219);
  std::__cxx11::string::substr((ulong)local_48,(ulong)cmd);
  std::__cxx11::string::substr((ulong)local_68,(ulong)cmd);
  std::ofstream::ofstream(local_278,"../users.txt",_S_app);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not open user.txt file");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cmd_local._4_4_ = -1;
    goto LAB_0010f99d;
  }
  getUsers();
  uVar4 = std::__cxx11::string::length();
  if (uVar4 < 0x20) {
    uVar4 = std::__cxx11::string::length();
    if (uVar4 < 4) goto LAB_0010f8ce;
    uVar4 = std::__cxx11::string::length();
    if (8 < uVar4) goto LAB_0010f8ce;
    local_2a8._M_current =
         (anon_struct_64_2_84df61a8 *)
         std::vector<User,_std::allocator<User>_>::begin((vector<User,_std::allocator<User>_> *)&it)
    ;
    local_2b0._M_current =
         (anon_struct_64_2_84df61a8 *)
         std::vector<User,_std::allocator<User>_>::end((vector<User,_std::allocator<User>_> *)&it);
    std::__cxx11::string::string((string *)&local_2d0,local_48);
    local_2a0 = std::
                find_if<__gnu_cxx::__normal_iterator<User*,std::vector<User,std::allocator<User>>>,newUser(std::__cxx11::string,int)::__0>
                          (local_2a8,local_2b0,&local_2d0);
    newUser(std::__cxx11::string,int)::$_0::~__0((__0 *)&local_2d0);
    local_2d8._M_current =
         (anon_struct_64_2_84df61a8 *)
         std::vector<User,_std::allocator<User>_>::end((vector<User,_std::allocator<User>_> *)&it);
    bVar2 = __gnu_cxx::operator==(&local_2a0,&local_2d8);
    if (bVar2) {
      poVar3 = (ostream *)std::ostream::operator<<(local_278,std::endl<char,std::char_traits<char>>)
      ;
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = std::operator<<(poVar3,local_48);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,local_68);
      std::operator<<(poVar3,")");
      sVar5 = send(socket_fd,"User successfully added!",0x1e,0);
      if (sVar5 == -1) {
        perror("send");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"User ");
      poVar3 = std::operator<<(poVar3,local_48);
      poVar3 = std::operator<<(poVar3," successfully added");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cmd_local._4_4_ = 1;
    }
    else {
      sVar5 = send(socket_fd,"User already Exists",0x19,0);
      if (sVar5 == -1) {
        perror("send");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"User ");
      poVar3 = std::operator<<(poVar3,local_48);
      poVar3 = std::operator<<(poVar3," already exists");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cmd_local._4_4_ = -1;
    }
  }
  else {
LAB_0010f8ce:
    sVar5 = send(socket_fd,"User/password not in bounds",0x1e,0);
    if (sVar5 == -1) {
      perror("send");
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"User ");
    poVar3 = std::operator<<(poVar3,local_48);
    poVar3 = std::operator<<(poVar3,"out of bounds");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    cmd_local._4_4_ = -2;
  }
  std::vector<User,_std::allocator<User>_>::~vector((vector<User,_std::allocator<User>_> *)&it);
LAB_0010f99d:
  std::ofstream::~ofstream(local_278);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return cmd_local._4_4_;
}

Assistant:

int newUser(string cmd, int socket_fd){

    //parse the username and password from the command string
    size_t spacePos = cmd.find(" ");
    string username = cmd.substr(0,spacePos);
    string password = cmd.substr(spacePos+1);


    //open the user file
    ofstream usersFile("../users.txt", std::ios_base::app);

    //make sure the file is open
    if(!usersFile.is_open()){
        cerr << "Could not open user.txt file" << endl;
        return -1;
    }

    //get the list of current users
    vector<User> users = getUsers();

    //check that everything is gucci
    if(username.length() < 32 && password.length() > 3 && password.length() < 9){

        //search the currently added users
        auto it = find_if(users.begin(),users.end(),[username](User u){
            return (u.username == username);
        });

        //if it was not found, add the user
        if(it == users.end()){

            //add the new user to the file
            usersFile << endl << "(" << username << ", " << password << ")";

            //send confirmation to client that everythings good
            if(send(socket_fd,"User successfully added!", 30, 0) == -1)
                perror("send");

            //server note
            cout << "User "<< username << " successfully added" << endl;
            return 1;
        }


        //the user already exists
        if(send(socket_fd, "User already Exists",25,0) == -1)
            perror("send");
        cout << "User " << username << " already exists" << endl;
        //return the error
        return USER_EXISTS;

    }

    if(send(socket_fd, "User/password not in bounds",30,0) == -1)
            perror("send");

    cout << "User " << username << "out of bounds" << endl;
    //return the specific error code
    return UP_NOT_IN_BOUNDS;

}